

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::LookupParameters::clear(LookupParameters *this)

{
  bool bVar1;
  reference puVar2;
  _Node_iterator<unsigned_int,_true,_false> *in_RDI;
  uint i;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<unsigned_int,_false> local_20;
  _Node_iterator_base<unsigned_int,_false> local_18;
  _Node_iterator<unsigned_int,_true,_false> *local_10;
  
  local_10 = in_RDI + 0xc;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    puVar2 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                       ((_Node_iterator<unsigned_int,_true,_false> *)0x35b3d9);
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
              ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 9),(ulong)*puVar2);
    TensorTools::Zero((Tensor *)0x35b3fb);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(in_RDI);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)0x35b415);
  return;
}

Assistant:

void LookupParameters::clear() {
  for (auto i : non_zero_grads)
    TensorTools::Zero(grads[i]);
  non_zero_grads.clear();
}